

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.h
# Opt level: O3

json __thiscall
JsonProtocol::SerializeArray<Stack>(JsonProtocol *this,vector<Stack,_std::allocator<Stack>_> *objs)

{
  pointer pSVar1;
  json_value extraout_RDX;
  json_value extraout_RDX_00;
  json_value jVar2;
  pointer pSVar3;
  json jVar4;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_30;
  
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)this,(initializer_list_t)ZEXT816(0),false,array);
  pSVar3 = (objs->super__Vector_base<Stack,_std::allocator<Stack>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pSVar1 = (objs->super__Vector_base<Stack,_std::allocator<Stack>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  jVar2 = extraout_RDX;
  if (pSVar3 != pSVar1) {
    do {
      (*(pSVar3->super_JsonProtocol)._vptr_JsonProtocol[2])(&local_30,pSVar3);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)this,&local_30);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_30);
      pSVar3 = pSVar3 + 1;
      jVar2 = extraout_RDX_00;
    } while (pSVar3 != pSVar1);
  }
  jVar4.m_value.object = jVar2.object;
  jVar4._0_8_ = this;
  return jVar4;
}

Assistant:

static nlohmann::json SerializeArray(std::vector<T> &objs) {
		auto arr = nlohmann::json::array();
		for (auto &obj: objs) {
			arr.push_back(obj.Serialize());
		}
		return arr;
	}